

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O0

void aom_highbd_filter_block1d8_v4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  short sVar25;
  undefined8 *puVar26;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined8 *in_R9;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar32;
  undefined8 uVar33;
  __m128i addFilterReg64;
  __m128i resReg34_56;
  __m128i resReg23_45;
  __m128i resReg34_56_hi;
  __m128i resReg23_45_hi;
  __m128i resReg34_56_lo;
  __m128i resReg23_45_lo;
  __m128i resReg56_hi;
  __m128i resReg45_hi;
  __m128i resReg34_hi;
  __m128i resReg23_hi;
  __m128i resReg56_lo;
  __m128i resReg45_lo;
  __m128i resReg34_lo;
  __m128i resReg23_lo;
  __m128i srcReg56_hi;
  __m128i srcReg56_lo;
  __m128i srcReg45_hi;
  __m128i srcReg45_lo;
  __m128i srcReg34_hi;
  __m128i srcReg34_lo;
  __m128i srcReg23_hi;
  __m128i srcReg23_lo;
  __m128i srcReg6;
  __m128i srcReg5;
  __m128i srcReg4;
  __m128i srcReg3;
  __m128i srcReg2;
  __m128i filtersReg;
  uint local_7cc;
  undefined8 local_7b8;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 *local_5c0;
  long local_5b0;
  undefined4 uStack_53c;
  undefined4 uStack_530;
  undefined4 uStack_524;
  undefined4 uStack_520;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_358;
  int iStack_354;
  int iStack_350;
  int iStack_34c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  __m128i tmp1;
  __m128i tmp0;
  __m128i max;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  ptrdiff_t dst_stride;
  ptrdiff_t src_stride;
  uint i;
  __m128i thirdFilters;
  __m128i secondFilters;
  
  sVar25 = (short)(1 << ((byte)addFilterReg64[1] & 0x1f)) + -1;
  uVar3 = in_R9[1];
  uVar32 = (undefined4)((ulong)*in_R9 >> 0x20);
  uStack_530 = (undefined4)uVar3;
  uStack_53c = (undefined4)((ulong)uVar3 >> 0x20);
  auVar1._4_8_ = uVar3;
  auVar1._0_4_ = uVar32;
  auVar27._0_8_ = auVar1._0_8_ << 0x20;
  auVar27._8_4_ = uStack_530;
  auVar27._12_4_ = uStack_53c;
  uStack_524 = (undefined4)*in_R9;
  auVar2._4_8_ = auVar27._8_8_;
  auVar2._0_4_ = uStack_524;
  auVar28._0_8_ = auVar2._0_8_ << 0x20;
  auVar28._8_4_ = uStack_520;
  auVar28._12_4_ = uVar32;
  uVar33 = auVar28._8_8_;
  uVar7 = CONCAT44(uStack_530,uStack_530);
  puVar26 = (undefined8 *)(in_RDI + in_RSI * 4);
  uVar3 = *puVar26;
  uVar4 = puVar26[1];
  puVar26 = (undefined8 *)(in_RDI + in_RSI * 6);
  uVar5 = *puVar26;
  uVar6 = puVar26[1];
  uStack_96 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_94 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_92 = (undefined2)((ulong)uVar3 >> 0x30);
  local_a8 = (undefined2)uVar5;
  uStack_a6 = (undefined2)((ulong)uVar5 >> 0x10);
  uStack_a4 = (undefined2)((ulong)uVar5 >> 0x20);
  uStack_a2 = (undefined2)((ulong)uVar5 >> 0x30);
  local_648 = CONCAT26(uStack_a6,CONCAT24(uStack_96,CONCAT22(local_a8,(short)uVar3)));
  uStack_640 = CONCAT26(uStack_a2,CONCAT24(uStack_92,CONCAT22(uStack_a4,uStack_94)));
  secondFilters[0]._2_2_ = (undefined2)((ulong)uVar4 >> 0x10);
  secondFilters[0]._4_2_ = (undefined2)((ulong)uVar4 >> 0x20);
  secondFilters[0]._6_2_ = (undefined2)((ulong)uVar4 >> 0x30);
  thirdFilters[0]._0_2_ = (undefined2)uVar6;
  thirdFilters[0]._2_2_ = (undefined2)((ulong)uVar6 >> 0x10);
  thirdFilters[0]._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
  thirdFilters[0]._6_2_ = (undefined2)((ulong)uVar6 >> 0x30);
  local_658 = CONCAT26(thirdFilters[0]._2_2_,
                       CONCAT24(secondFilters[0]._2_2_,
                                CONCAT22((undefined2)thirdFilters[0],(short)uVar4)));
  uStack_650 = CONCAT26(thirdFilters[0]._6_2_,
                        CONCAT24(secondFilters[0]._6_2_,
                                 CONCAT22(thirdFilters[0]._4_2_,secondFilters[0]._4_2_)));
  puVar26 = (undefined8 *)(in_RDI + in_RSI * 8);
  local_618 = *puVar26;
  uStack_610 = puVar26[1];
  local_c8 = (undefined2)local_618;
  uStack_c6 = (undefined2)((ulong)local_618 >> 0x10);
  uStack_c4 = (undefined2)((ulong)local_618 >> 0x20);
  uStack_c2 = (undefined2)((ulong)local_618 >> 0x30);
  local_668 = CONCAT26(uStack_c6,CONCAT24(uStack_a6,CONCAT22(local_c8,local_a8)));
  uStack_660 = CONCAT26(uStack_c2,CONCAT24(uStack_a2,CONCAT22(uStack_c4,uStack_a4)));
  uStack_40 = (undefined2)uStack_610;
  uStack_3e = (undefined2)((ulong)uStack_610 >> 0x10);
  uStack_3c = (undefined2)((ulong)uStack_610 >> 0x20);
  uStack_3a = (undefined2)((ulong)uStack_610 >> 0x30);
  local_678 = CONCAT26(uStack_3e,
                       CONCAT24(thirdFilters[0]._2_2_,
                                CONCAT22(uStack_40,(undefined2)thirdFilters[0])));
  uStack_670 = CONCAT26(uStack_3a,
                        CONCAT24(thirdFilters[0]._6_2_,CONCAT22(uStack_3c,thirdFilters[0]._4_2_)));
  local_5c0 = in_RDX;
  local_5b0 = in_RDI;
  for (local_7cc = in_R8D; 1 < local_7cc; local_7cc = local_7cc - 2) {
    puVar26 = (undefined8 *)(local_5b0 + in_RSI * 10);
    uVar3 = *puVar26;
    uVar4 = puVar26[1];
    local_d8 = (undefined2)local_618;
    uStack_d6 = (undefined2)((ulong)local_618 >> 0x10);
    uStack_d4 = (undefined2)((ulong)local_618 >> 0x20);
    uStack_d2 = (undefined2)((ulong)local_618 >> 0x30);
    local_e8 = (undefined2)uVar3;
    uStack_e6 = (undefined2)((ulong)uVar3 >> 0x10);
    uStack_e4 = (undefined2)((ulong)uVar3 >> 0x20);
    uStack_e2 = (undefined2)((ulong)uVar3 >> 0x30);
    max[0]._0_2_ = (undefined2)uStack_610;
    max[0]._2_2_ = (undefined2)((ulong)uStack_610 >> 0x10);
    max[0]._4_2_ = (undefined2)((ulong)uStack_610 >> 0x20);
    max[0]._6_2_ = (undefined2)((ulong)uStack_610 >> 0x30);
    tmp0[0]._0_2_ = (undefined2)uVar4;
    tmp0[0]._2_2_ = (undefined2)((ulong)uVar4 >> 0x10);
    tmp0[0]._4_2_ = (undefined2)((ulong)uVar4 >> 0x20);
    tmp0[0]._6_2_ = (undefined2)((ulong)uVar4 >> 0x30);
    puVar26 = (undefined8 *)(local_5b0 + in_RSI * 0xc);
    local_618 = *puVar26;
    uStack_610 = puVar26[1];
    local_108 = (undefined2)local_618;
    uStack_106 = (undefined2)((ulong)local_618 >> 0x10);
    uStack_104 = (undefined2)((ulong)local_618 >> 0x20);
    uStack_102 = (undefined2)((ulong)local_618 >> 0x30);
    uStack_80 = (undefined2)uStack_610;
    uStack_7e = (undefined2)((ulong)uStack_610 >> 0x10);
    uStack_7c = (undefined2)((ulong)uStack_610 >> 0x20);
    uStack_7a = (undefined2)((ulong)uStack_610 >> 0x30);
    auVar20._8_8_ = uStack_640;
    auVar20._0_8_ = local_648;
    auVar19._8_8_ = uVar33;
    auVar19._0_8_ = local_7b8;
    auVar27 = pmaddwd(auVar20,auVar19);
    auVar18._8_8_ = uStack_660;
    auVar18._0_8_ = local_668;
    auVar17._8_8_ = uVar33;
    auVar17._0_8_ = local_7b8;
    auVar28 = pmaddwd(auVar18,auVar17);
    auVar16._2_2_ = local_e8;
    auVar16._0_2_ = local_d8;
    auVar16._4_2_ = uStack_d6;
    auVar16._6_2_ = uStack_e6;
    auVar16._10_2_ = uStack_e4;
    auVar16._8_2_ = uStack_d4;
    auVar16._12_2_ = uStack_d2;
    auVar16._14_2_ = uStack_e2;
    auVar15._8_8_ = uVar7;
    auVar15._0_8_ = uVar7;
    auVar29 = pmaddwd(auVar16,auVar15);
    auVar14._2_2_ = local_108;
    auVar14._0_2_ = local_e8;
    auVar14._4_2_ = uStack_e6;
    auVar14._6_2_ = uStack_106;
    auVar14._10_2_ = uStack_104;
    auVar14._8_2_ = uStack_e4;
    auVar14._12_2_ = uStack_e2;
    auVar14._14_2_ = uStack_102;
    auVar13._8_8_ = uVar7;
    auVar13._0_8_ = uVar7;
    auVar30 = pmaddwd(auVar14,auVar13);
    local_2f8 = auVar27._0_4_;
    iStack_2f4 = auVar27._4_4_;
    iStack_2f0 = auVar27._8_4_;
    iStack_2ec = auVar27._12_4_;
    local_308 = auVar29._0_4_;
    iStack_304 = auVar29._4_4_;
    iStack_300 = auVar29._8_4_;
    iStack_2fc = auVar29._12_4_;
    local_318 = auVar28._0_4_;
    iStack_314 = auVar28._4_4_;
    iStack_310 = auVar28._8_4_;
    iStack_30c = auVar28._12_4_;
    local_328 = auVar30._0_4_;
    iStack_324 = auVar30._4_4_;
    iStack_320 = auVar30._8_4_;
    iStack_31c = auVar30._12_4_;
    auVar12._8_8_ = uStack_650;
    auVar12._0_8_ = local_658;
    auVar11._8_8_ = uVar33;
    auVar11._0_8_ = local_7b8;
    auVar27 = pmaddwd(auVar12,auVar11);
    auVar10._8_8_ = uStack_670;
    auVar10._0_8_ = local_678;
    auVar9._8_8_ = uVar33;
    auVar9._0_8_ = local_7b8;
    auVar28 = pmaddwd(auVar10,auVar9);
    auVar8._2_2_ = (undefined2)tmp0[0];
    auVar8._0_2_ = (undefined2)max[0];
    auVar8._4_2_ = max[0]._2_2_;
    auVar8._6_2_ = tmp0[0]._2_2_;
    auVar8._10_2_ = tmp0[0]._4_2_;
    auVar8._8_2_ = max[0]._4_2_;
    auVar8._12_2_ = max[0]._6_2_;
    auVar8._14_2_ = tmp0[0]._6_2_;
    auVar31._8_8_ = uVar7;
    auVar31._0_8_ = uVar7;
    auVar31 = pmaddwd(auVar8,auVar31);
    auVar30._2_2_ = uStack_80;
    auVar30._0_2_ = (undefined2)tmp0[0];
    auVar30._4_2_ = tmp0[0]._2_2_;
    auVar30._6_2_ = uStack_7e;
    auVar30._10_2_ = uStack_7c;
    auVar30._8_2_ = tmp0[0]._4_2_;
    auVar30._12_2_ = tmp0[0]._6_2_;
    auVar30._14_2_ = uStack_7a;
    auVar29._8_8_ = uVar7;
    auVar29._0_8_ = uVar7;
    auVar29 = pmaddwd(auVar30,auVar29);
    local_338 = auVar27._0_4_;
    iStack_334 = auVar27._4_4_;
    iStack_330 = auVar27._8_4_;
    iStack_32c = auVar27._12_4_;
    local_348 = auVar31._0_4_;
    iStack_344 = auVar31._4_4_;
    iStack_340 = auVar31._8_4_;
    iStack_33c = auVar31._12_4_;
    local_358 = auVar28._0_4_;
    iStack_354 = auVar28._4_4_;
    iStack_350 = auVar28._8_4_;
    iStack_34c = auVar28._12_4_;
    local_368 = auVar29._0_4_;
    iStack_364 = auVar29._4_4_;
    iStack_360 = auVar29._8_4_;
    iStack_35c = auVar29._12_4_;
    auVar27 = ZEXT416(7);
    auVar28 = ZEXT416(7);
    auVar29 = ZEXT416(7);
    auVar30 = ZEXT416(7);
    auVar24._4_4_ = iStack_2f4 + iStack_304 + 0x40 >> auVar27;
    auVar24._0_4_ = local_2f8 + local_308 + 0x40 >> auVar27;
    auVar24._12_4_ = iStack_2ec + iStack_2fc + 0x40 >> auVar27;
    auVar24._8_4_ = iStack_2f0 + iStack_300 + 0x40 >> auVar27;
    auVar23._4_4_ = iStack_334 + iStack_344 + 0x40 >> auVar29;
    auVar23._0_4_ = local_338 + local_348 + 0x40 >> auVar29;
    auVar23._12_4_ = iStack_32c + iStack_33c + 0x40 >> auVar29;
    auVar23._8_4_ = iStack_330 + iStack_340 + 0x40 >> auVar29;
    auVar27 = packssdw(auVar24,auVar23);
    auVar22._4_4_ = iStack_314 + iStack_324 + 0x40 >> auVar28;
    auVar22._0_4_ = local_318 + local_328 + 0x40 >> auVar28;
    auVar22._12_4_ = iStack_30c + iStack_31c + 0x40 >> auVar28;
    auVar22._8_4_ = iStack_310 + iStack_320 + 0x40 >> auVar28;
    auVar21._4_4_ = iStack_354 + iStack_364 + 0x40 >> auVar30;
    auVar21._0_4_ = local_358 + local_368 + 0x40 >> auVar30;
    auVar21._12_4_ = iStack_34c + iStack_35c + 0x40 >> auVar30;
    auVar21._8_4_ = iStack_350 + iStack_360 + 0x40 >> auVar30;
    auVar28 = packssdw(auVar22,auVar21);
    local_1f8 = auVar27._0_2_;
    sStack_1f6 = auVar27._2_2_;
    sStack_1f4 = auVar27._4_2_;
    sStack_1f2 = auVar27._6_2_;
    sStack_1f0 = auVar27._8_2_;
    sStack_1ee = auVar27._10_2_;
    sStack_1ec = auVar27._12_2_;
    sStack_1ea = auVar27._14_2_;
    local_1f8 = (ushort)(-1 < local_1f8) * local_1f8;
    sStack_1f6 = (ushort)(-1 < sStack_1f6) * sStack_1f6;
    sStack_1f4 = (ushort)(-1 < sStack_1f4) * sStack_1f4;
    sStack_1f2 = (ushort)(-1 < sStack_1f2) * sStack_1f2;
    sStack_1f0 = (ushort)(-1 < sStack_1f0) * sStack_1f0;
    sStack_1ee = (ushort)(-1 < sStack_1ee) * sStack_1ee;
    sStack_1ec = (ushort)(-1 < sStack_1ec) * sStack_1ec;
    sStack_1ea = (ushort)(-1 < sStack_1ea) * sStack_1ea;
    local_788._0_4_ =
         CONCAT22((ushort)(sVar25 < sStack_1f6) * sVar25 |
                  (ushort)(sVar25 >= sStack_1f6) * sStack_1f6,
                  (ushort)(sVar25 < local_1f8) * sVar25 | (ushort)(sVar25 >= local_1f8) * local_1f8)
    ;
    local_788._0_6_ =
         CONCAT24((ushort)(sVar25 < sStack_1f4) * sVar25 |
                  (ushort)(sVar25 >= sStack_1f4) * sStack_1f4,(undefined4)local_788);
    local_788 = CONCAT26((ushort)(sVar25 < sStack_1f2) * sVar25 |
                         (ushort)(sVar25 >= sStack_1f2) * sStack_1f2,(undefined6)local_788);
    uStack_780._0_2_ =
         (ushort)(sVar25 < sStack_1f0) * sVar25 | (ushort)(sVar25 >= sStack_1f0) * sStack_1f0;
    uStack_780._2_2_ =
         (ushort)(sVar25 < sStack_1ee) * sVar25 | (ushort)(sVar25 >= sStack_1ee) * sStack_1ee;
    uStack_780._4_2_ =
         (ushort)(sVar25 < sStack_1ec) * sVar25 | (ushort)(sVar25 >= sStack_1ec) * sStack_1ec;
    uStack_780._6_2_ =
         (ushort)(sVar25 < sStack_1ea) * sVar25 | (ushort)(sVar25 >= sStack_1ea) * sStack_1ea;
    local_218 = auVar28._0_2_;
    sStack_216 = auVar28._2_2_;
    sStack_214 = auVar28._4_2_;
    sStack_212 = auVar28._6_2_;
    sStack_210 = auVar28._8_2_;
    sStack_20e = auVar28._10_2_;
    sStack_20c = auVar28._12_2_;
    sStack_20a = auVar28._14_2_;
    local_218 = (ushort)(-1 < local_218) * local_218;
    sStack_216 = (ushort)(-1 < sStack_216) * sStack_216;
    sStack_214 = (ushort)(-1 < sStack_214) * sStack_214;
    sStack_212 = (ushort)(-1 < sStack_212) * sStack_212;
    sStack_210 = (ushort)(-1 < sStack_210) * sStack_210;
    sStack_20e = (ushort)(-1 < sStack_20e) * sStack_20e;
    sStack_20c = (ushort)(-1 < sStack_20c) * sStack_20c;
    sStack_20a = (ushort)(-1 < sStack_20a) * sStack_20a;
    local_798._0_4_ =
         CONCAT22((ushort)(sVar25 < sStack_216) * sVar25 |
                  (ushort)(sVar25 >= sStack_216) * sStack_216,
                  (ushort)(sVar25 < local_218) * sVar25 | (ushort)(sVar25 >= local_218) * local_218)
    ;
    local_798._0_6_ =
         CONCAT24((ushort)(sVar25 < sStack_214) * sVar25 |
                  (ushort)(sVar25 >= sStack_214) * sStack_214,(undefined4)local_798);
    local_798 = CONCAT26((ushort)(sVar25 < sStack_212) * sVar25 |
                         (ushort)(sVar25 >= sStack_212) * sStack_212,(undefined6)local_798);
    uStack_790._0_2_ =
         (ushort)(sVar25 < sStack_210) * sVar25 | (ushort)(sVar25 >= sStack_210) * sStack_210;
    uStack_790._2_2_ =
         (ushort)(sVar25 < sStack_20e) * sVar25 | (ushort)(sVar25 >= sStack_20e) * sStack_20e;
    uStack_790._4_2_ =
         (ushort)(sVar25 < sStack_20c) * sVar25 | (ushort)(sVar25 >= sStack_20c) * sStack_20c;
    uStack_790._6_2_ =
         (ushort)(sVar25 < sStack_20a) * sVar25 | (ushort)(sVar25 >= sStack_20a) * sStack_20a;
    local_5b0 = in_RSI * 4 + local_5b0;
    *local_5c0 = local_788;
    local_5c0[1] = uStack_780;
    puVar26 = (undefined8 *)((long)local_5c0 + in_RCX * 2);
    *puVar26 = local_798;
    puVar26[1] = uStack_790;
    local_5c0 = (undefined8 *)(in_RCX * 4 + (long)local_5c0);
    local_648 = CONCAT26(uStack_e6,CONCAT24(uStack_d6,CONCAT22(local_e8,local_d8)));
    uStack_640 = CONCAT26(uStack_e2,CONCAT24(uStack_d2,CONCAT22(uStack_e4,uStack_d4)));
    local_658 = CONCAT26(tmp0[0]._2_2_,
                         CONCAT24(max[0]._2_2_,CONCAT22((undefined2)tmp0[0],(undefined2)max[0])));
    uStack_650 = CONCAT26(tmp0[0]._6_2_,CONCAT24(max[0]._6_2_,CONCAT22(tmp0[0]._4_2_,max[0]._4_2_)))
    ;
    local_668 = CONCAT26(uStack_106,CONCAT24(uStack_e6,CONCAT22(local_108,local_e8)));
    uStack_660 = CONCAT26(uStack_102,CONCAT24(uStack_e2,CONCAT22(uStack_104,uStack_e4)));
    local_678 = CONCAT26(uStack_7e,CONCAT24(tmp0[0]._2_2_,CONCAT22(uStack_80,(undefined2)tmp0[0])));
    uStack_670 = CONCAT26(uStack_7a,CONCAT24(tmp0[0]._6_2_,CONCAT22(uStack_7c,tmp0[0]._4_2_)));
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_v4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i filtersReg;
  __m128i srcReg2, srcReg3, srcReg4, srcReg5, srcReg6;
  __m128i srcReg23_lo, srcReg23_hi, srcReg34_lo, srcReg34_hi;
  __m128i srcReg45_lo, srcReg45_hi, srcReg56_lo, srcReg56_hi;
  __m128i resReg23_lo, resReg34_lo, resReg45_lo, resReg56_lo;
  __m128i resReg23_hi, resReg34_hi, resReg45_hi, resReg56_hi;
  __m128i resReg23_45_lo, resReg34_56_lo, resReg23_45_hi, resReg34_56_hi;
  __m128i resReg23_45, resReg34_56;
  __m128i addFilterReg64, secondFilters, thirdFilters;
  unsigned int i;
  ptrdiff_t src_stride, dst_stride;

  const __m128i max = _mm_set1_epi16((1 << bd) - 1);
  addFilterReg64 = _mm_set1_epi32(64);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);

  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp0 = _mm_unpacklo_epi32(filtersReg, filtersReg);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp1 = _mm_unpackhi_epi32(filtersReg, filtersReg);

  secondFilters = _mm_unpackhi_epi64(tmp0, tmp0);  // coeffs 2 3 2 3 2 3 2 3
  thirdFilters = _mm_unpacklo_epi64(tmp1, tmp1);   // coeffs 4 5 4 5 4 5 4 5

  // multiple the size of the source and destination stride by two
  src_stride = src_pitch << 1;
  dst_stride = dst_pitch << 1;

  srcReg2 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 2));
  srcReg3 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 3));
  srcReg23_lo = _mm_unpacklo_epi16(srcReg2, srcReg3);
  srcReg23_hi = _mm_unpackhi_epi16(srcReg2, srcReg3);

  srcReg4 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 4));
  srcReg34_lo = _mm_unpacklo_epi16(srcReg3, srcReg4);
  srcReg34_hi = _mm_unpackhi_epi16(srcReg3, srcReg4);

  for (i = height; i > 1; i -= 2) {
    srcReg5 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 5));

    srcReg45_lo = _mm_unpacklo_epi16(srcReg4, srcReg5);
    srcReg45_hi = _mm_unpackhi_epi16(srcReg4, srcReg5);

    srcReg6 = _mm_loadu_si128((const __m128i *)(src_ptr + src_pitch * 6));

    srcReg56_lo = _mm_unpacklo_epi16(srcReg5, srcReg6);
    srcReg56_hi = _mm_unpackhi_epi16(srcReg5, srcReg6);

    // multiply 2 adjacent elements with the filter and add the result

    resReg23_lo = _mm_madd_epi16(srcReg23_lo, secondFilters);
    resReg34_lo = _mm_madd_epi16(srcReg34_lo, secondFilters);
    resReg45_lo = _mm_madd_epi16(srcReg45_lo, thirdFilters);
    resReg56_lo = _mm_madd_epi16(srcReg56_lo, thirdFilters);

    resReg23_45_lo = _mm_add_epi32(resReg23_lo, resReg45_lo);
    resReg34_56_lo = _mm_add_epi32(resReg34_lo, resReg56_lo);

    // multiply 2 adjacent elements with the filter and add the result

    resReg23_hi = _mm_madd_epi16(srcReg23_hi, secondFilters);
    resReg34_hi = _mm_madd_epi16(srcReg34_hi, secondFilters);
    resReg45_hi = _mm_madd_epi16(srcReg45_hi, thirdFilters);
    resReg56_hi = _mm_madd_epi16(srcReg56_hi, thirdFilters);

    resReg23_45_hi = _mm_add_epi32(resReg23_hi, resReg45_hi);
    resReg34_56_hi = _mm_add_epi32(resReg34_hi, resReg56_hi);

    // shift by 7 bit each 32 bit
    resReg23_45_lo = _mm_add_epi32(resReg23_45_lo, addFilterReg64);
    resReg34_56_lo = _mm_add_epi32(resReg34_56_lo, addFilterReg64);
    resReg23_45_hi = _mm_add_epi32(resReg23_45_hi, addFilterReg64);
    resReg34_56_hi = _mm_add_epi32(resReg34_56_hi, addFilterReg64);
    resReg23_45_lo = _mm_srai_epi32(resReg23_45_lo, 7);
    resReg34_56_lo = _mm_srai_epi32(resReg34_56_lo, 7);
    resReg23_45_hi = _mm_srai_epi32(resReg23_45_hi, 7);
    resReg34_56_hi = _mm_srai_epi32(resReg34_56_hi, 7);

    // shrink to 16 bit each 32 bits, the first lane contain the first
    // convolve result and the second lane contain the second convolve
    // result
    resReg23_45 = _mm_packs_epi32(resReg23_45_lo, resReg23_45_hi);
    resReg34_56 = _mm_packs_epi32(resReg34_56_lo, resReg34_56_hi);

    resReg23_45 = _mm_max_epi16(resReg23_45, _mm_setzero_si128());
    resReg23_45 = _mm_min_epi16(resReg23_45, max);
    resReg34_56 = _mm_max_epi16(resReg34_56, _mm_setzero_si128());
    resReg34_56 = _mm_min_epi16(resReg34_56, max);

    src_ptr += src_stride;

    _mm_store_si128((__m128i *)dst_ptr, (resReg23_45));
    _mm_store_si128((__m128i *)(dst_ptr + dst_pitch), (resReg34_56));

    dst_ptr += dst_stride;

    // save part of the registers for next strides
    srcReg23_lo = srcReg45_lo;
    srcReg23_hi = srcReg45_hi;
    srcReg34_lo = srcReg56_lo;
    srcReg34_hi = srcReg56_hi;
    srcReg4 = srcReg6;
  }
}